

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

int __thiscall google::protobuf::SourceCodeInfo_Location::ByteSize(SourceCodeInfo_Location *this)

{
  bool bVar1;
  int iVar2;
  int32 iVar3;
  string *psVar4;
  UnknownFieldSet *pUVar5;
  int local_24;
  int local_20;
  int i_1;
  int data_size_1;
  int i;
  int data_size;
  int total_size;
  SourceCodeInfo_Location *this_local;
  
  i = 0;
  if ((this->_has_bits_[0] & 0x3fc) != 0) {
    bVar1 = has_leading_comments(this);
    if (bVar1) {
      psVar4 = leading_comments_abi_cxx11_(this);
      iVar2 = internal::WireFormatLite::StringSize(psVar4);
      i = iVar2 + 1;
    }
    bVar1 = has_trailing_comments(this);
    if (bVar1) {
      psVar4 = trailing_comments_abi_cxx11_(this);
      iVar2 = internal::WireFormatLite::StringSize(psVar4);
      i = iVar2 + 1 + i;
    }
  }
  data_size_1 = 0;
  for (i_1 = 0; iVar2 = path_size(this), i_1 < iVar2; i_1 = i_1 + 1) {
    iVar3 = path(this,i_1);
    iVar2 = internal::WireFormatLite::Int32Size(iVar3);
    data_size_1 = iVar2 + data_size_1;
  }
  if (0 < data_size_1) {
    iVar2 = internal::WireFormatLite::Int32Size(data_size_1);
    i = iVar2 + 1 + i;
  }
  this->_path_cached_byte_size_ = data_size_1;
  i = data_size_1 + i;
  local_20 = 0;
  for (local_24 = 0; iVar2 = span_size(this), local_24 < iVar2; local_24 = local_24 + 1) {
    iVar3 = span(this,local_24);
    iVar2 = internal::WireFormatLite::Int32Size(iVar3);
    local_20 = iVar2 + local_20;
  }
  if (0 < local_20) {
    iVar2 = internal::WireFormatLite::Int32Size(local_20);
    i = iVar2 + 1 + i;
  }
  this->_span_cached_byte_size_ = local_20;
  i = local_20 + i;
  pUVar5 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar5);
  if (!bVar1) {
    pUVar5 = unknown_fields(this);
    iVar2 = internal::WireFormat::ComputeUnknownFieldsSize(pUVar5);
    i = iVar2 + i;
  }
  this->_cached_size_ = i;
  return i;
}

Assistant:

int SourceCodeInfo_Location::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[2 / 32] & (0xffu << (2 % 32))) {
    // optional string leading_comments = 3;
    if (has_leading_comments()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->leading_comments());
    }

    // optional string trailing_comments = 4;
    if (has_trailing_comments()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->trailing_comments());
    }

  }
  // repeated int32 path = 1 [packed = true];
  {
    int data_size = 0;
    for (int i = 0; i < this->path_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->path(i));
    }
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _path_cached_byte_size_ = data_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated int32 span = 2 [packed = true];
  {
    int data_size = 0;
    for (int i = 0; i < this->span_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->span(i));
    }
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _span_cached_byte_size_ = data_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}